

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_java_struct
          (t_javame_generator *this,t_struct *tstruct,bool is_exception)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  int __oflag;
  t_javame_generator *ptVar3;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> *out;
  string f_struct_name;
  ofstream_with_content_based_conditional_update f_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [32];
  string local_220;
  undefined1 local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1c0;
  
  std::operator+(&local_260,&this->package_dir_,"/");
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
                 &local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_200 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
                 ".java");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_260);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1c0);
  std::__cxx11::string::string
            ((string *)&local_260,local_1e0._M_dataplus._M_p,(allocator *)local_240);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1c0,(char *)&local_260,__oflag);
  std::__cxx11::string::~string((string *)&local_260);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_260,this);
  poVar2 = std::operator<<((ostream *)&local_1c0,(string *)&local_260);
  java_package_abi_cxx11_((string *)local_240,this);
  ptVar3 = (t_javame_generator *)local_240;
  poVar2 = std::operator<<(poVar2,(string *)ptVar3);
  java_type_imports_abi_cxx11_((string *)local_200,ptVar3);
  ptVar3 = (t_javame_generator *)local_200;
  poVar2 = std::operator<<(poVar2,(string *)ptVar3);
  java_thrift_imports_abi_cxx11_((string *)(local_240 + 0x20),ptVar3);
  std::operator<<(poVar2,(string *)(local_240 + 0x20));
  std::__cxx11::string::~string((string *)(local_240 + 0x20));
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string((string *)&local_260);
  out = &local_1c0;
  generate_java_struct_definition(this,(ostream *)out,tstruct,is_exception,false,false);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&local_1c0,(int)out);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1c0);
  std::__cxx11::string::~string((string *)(local_200 + 0x20));
  return;
}

Assistant:

void t_javame_generator::generate_java_struct(t_struct* tstruct, bool is_exception) {
  // Make output file
  string f_struct_name = package_dir_ + "/" + (tstruct->get_name()) + ".java";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << java_package() << java_type_imports() << java_thrift_imports();

  generate_java_struct_definition(f_struct, tstruct, is_exception);
  f_struct.close();
}